

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

void __thiscall Vector<long_double>::Vector(Vector<long_double> *this,int csize,longdouble *val)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  unkbyte10 *in_RDX;
  int in_ESI;
  int *in_RDI;
  longdouble *p;
  ulong local_58;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  *in_RDI = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  if (0 < in_ESI) {
    *in_RDI = in_ESI;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)*in_RDI;
    uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    *(void **)(in_RDI + 2) = pvVar3;
    if (*(long *)(in_RDI + 2) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      ::error((string *)0x10b9b56);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
    }
  }
  local_58 = *(long *)(in_RDI + 2) + (long)*in_RDI * 0x10;
  while (*(ulong *)(in_RDI + 2) < local_58) {
    *(unkbyte10 *)(local_58 - 0x10) = *in_RDX;
    local_58 = local_58 - 0x10;
  }
  return;
}

Assistant:

Vector< T >::Vector(int csize, const T& val) : num_elts(0), ptr_to_data((T*)0)
{
#ifdef DEBUG
	std::cerr << "Vector<>::Vector(int, const T& )|size constructor   |";
#endif

    if (csize > 0 ){
	num_elts = csize;
	ptr_to_data = new T[num_elts];

	if ( ptr_to_data == 0 ) error("Vector<>::Vector(), Memoire insuffisante");
    } 

  T* p = ptr_to_data + num_elts;
  while ( p > ptr_to_data ) 
    *--p = val;//pb si = n'est pas surcharge pour le type T

#ifdef DEBUG
    fprintf(stderr," adr =  %x \n", ptr_to_data);
#endif
}